

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.cpp
# Opt level: O0

bool match4(StreamReaderAny *stream,char *string)

{
  int8_t iVar1;
  int8_t iVar2;
  int8_t iVar3;
  int8_t iVar4;
  bool local_1d;
  char tmp [4];
  char *string_local;
  StreamReaderAny *stream_local;
  
  if (string != (char *)0x0) {
    iVar1 = Assimp::StreamReader<true,_true>::GetI1(stream);
    iVar2 = Assimp::StreamReader<true,_true>::GetI1(stream);
    iVar3 = Assimp::StreamReader<true,_true>::GetI1(stream);
    iVar4 = Assimp::StreamReader<true,_true>::GetI1(stream);
    local_1d = false;
    if (((iVar1 == *string) && (local_1d = false, iVar2 == string[1])) &&
       (local_1d = false, iVar3 == string[2])) {
      local_1d = iVar4 == string[3];
    }
    return local_1d;
  }
  __assert_fail("nullptr != string",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Blender/BlenderDNA.cpp"
                ,0x3c,"bool match4(StreamReaderAny &, const char *)");
}

Assistant:

static bool match4(StreamReaderAny& stream, const char* string) {
    ai_assert( nullptr != string );
    char tmp[4];
    tmp[ 0 ] = ( stream ).GetI1();
    tmp[ 1 ] = ( stream ).GetI1();
    tmp[ 2 ] = ( stream ).GetI1();
    tmp[ 3 ] = ( stream ).GetI1();
    return (tmp[0]==string[0] && tmp[1]==string[1] && tmp[2]==string[2] && tmp[3]==string[3]);
}